

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

JointObservation * __thiscall
MADPComponentDiscreteObservations::GetJointObservation
          (MADPComponentDiscreteObservations *this,Index i)

{
  ostream *poVar1;
  undefined8 uVar2;
  size_type sVar3;
  const_reference ppJVar4;
  E *this_00;
  stringstream *arg;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  stringstream ss_1;
  stringstream *in_stack_fffffffffffffc78;
  E *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffca8;
  E *in_stack_fffffffffffffcb0;
  stringstream local_330 [16];
  ostream local_320 [392];
  stringstream local_198 [16];
  ostream local_188 [380];
  uint local_c;
  
  local_c = in_ESI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"MADPComponentDiscreteObservations::GetJointObservation(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  sVar3 = std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::size
                    ((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                      *)(in_RDI + 0x20));
  if (in_ESI < sVar3) {
    ppJVar4 = std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
              operator[]((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                          *)(in_RDI + 0x20),(ulong)local_c);
    return &(*ppJVar4)->super_JointObservation;
  }
  std::__cxx11::stringstream::stringstream(local_330);
  poVar1 = std::operator<<(local_320,
                           "WARNING MADPComponentDiscreteObservations::GetJointObservation(Index i) index out of bounds (i="
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  this_00 = (E *)std::operator<<(poVar1,")");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  arg = (stringstream *)__cxa_allocate_exception(0x28);
  E::E(this_00,arg);
  __cxa_throw(arg,&E::typeinfo,E::~E);
}

Assistant:

const JointObservation* MADPComponentDiscreteObservations::GetJointObservation(Index i) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::GetJointObservation("<< 
        i<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(!_m_cachedAllJointObservations)
    {
        throw E("MADPComponentDiscreteObservations::GetJointObservationDiscrete: joint observations have not been created");
    }
    if(i < _m_jointObservationVec.size() )
        return( (const JointObservation*) _m_jointObservationVec[i] );
    //else        
    stringstream ss;
    ss << "WARNING MADPComponentDiscreteObservations::GetJointObservation(Index i) index out of bounds (i="<< i <<")"<<endl;
    throw E(ss);
}